

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed-dtoa.cc
# Opt level: O1

void double_conversion::RoundUp(Vector<char> buffer,int *length,int *decimal_point)

{
  char cVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  int *piVar5;
  char *pcVar6;
  
  piVar5 = buffer._8_8_;
  pcVar6 = buffer.start_;
  if ((long)*piVar5 == 0) {
    *pcVar6 = '1';
    *length = 1;
    *piVar5 = 1;
    return;
  }
  pcVar6[(long)*piVar5 + -1] = pcVar6[(long)*piVar5 + -1] + '\x01';
  lVar4 = (long)*piVar5;
  bVar2 = lVar4 < 2;
  if (1 < lVar4) {
    cVar1 = pcVar6[lVar4 + -1];
    while (cVar1 == ':') {
      pcVar6[lVar4 + -1] = '0';
      pcVar6[lVar4 + -2] = pcVar6[lVar4 + -2] + '\x01';
      bVar2 = lVar4 < 3;
      if (lVar4 < 3) goto LAB_0087a2d3;
      lVar3 = lVar4 + -2;
      lVar4 = lVar4 + -1;
      cVar1 = pcVar6[lVar3];
    }
    if (!bVar2) {
      return;
    }
  }
LAB_0087a2d3:
  if (*pcVar6 == ':') {
    *pcVar6 = '1';
    *length = *length + 1;
  }
  return;
}

Assistant:

static void RoundUp(Vector<char> buffer, int* length, int* decimal_point) {
  // An empty buffer represents 0.
  if (*length == 0) {
    buffer[0] = '1';
    *decimal_point = 1;
    *length = 1;
    return;
  }
  // Round the last digit until we either have a digit that was not '9' or until
  // we reached the first digit.
  buffer[(*length) - 1]++;
  for (int i = (*length) - 1; i > 0; --i) {
    if (buffer[i] != '0' + 10) {
      return;
    }
    buffer[i] = '0';
    buffer[i - 1]++;
  }
  // If the first digit is now '0' + 10, we would need to set it to '0' and add
  // a '1' in front. However we reach the first digit only if all following
  // digits had been '9' before rounding up. Now all trailing digits are '0' and
  // we simply switch the first digit to '1' and update the decimal-point
  // (indicating that the point is now one digit to the right).
  if (buffer[0] == '0' + 10) {
    buffer[0] = '1';
    (*decimal_point)++;
  }
}